

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O2

Error * ot::commissioner::ActiveDatasetFromJson
                  (Error *__return_storage_ptr__,ActiveOperationalDataset *aDataset,string *aJson)

{
  char cVar1;
  char *from;
  char *to;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  Json json;
  undefined1 local_178 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_170 [4];
  string local_150;
  writer write;
  _Any_data local_128;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined1 local_108 [32];
  format_string_checker<char> *local_e8;
  _Alloc_hider local_e0;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  ActiveOperationalDataset::ActiveOperationalDataset((ActiveOperationalDataset *)local_108);
  ActiveOperationalDataset::operator=(aDataset,(ActiveOperationalDataset *)local_108);
  ActiveOperationalDataset::~ActiveOperationalDataset((ActiveOperationalDataset *)local_108);
  StripComments((string *)local_108,aJson);
  nlohmann::detail::input_adapter::
  input_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            ((input_adapter *)local_178,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108);
  local_118 = 0;
  uStack_110 = 0;
  local_128._M_unused._M_object = (void *)0x0;
  local_128._8_8_ = 0;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::parse(&json,(input_adapter *)local_178,(parser_callback_t *)&local_128,true);
  std::_Function_base::~_Function_base((_Function_base *)&local_128);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_170);
  std::__cxx11::string::~string((string *)local_108);
  if (json.m_type == null) {
    local_108._0_4_ = none_type;
    local_108._8_8_ = "Empty active operational dataset JSON";
    local_108._16_8_ = (pointer)0x25;
    local_108._24_8_ = (pointer)0x0;
    local_e0._M_p = (pointer)0x0;
    from = "Empty active operational dataset JSON";
    write.handler_ = (format_string_checker<char> *)local_108;
    local_e8 = (format_string_checker<char> *)local_108;
    while (from != "") {
      cVar1 = *from;
      to = from;
      while (cVar1 != '{') {
        to = to + 1;
        if (to == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&write,from,"");
          goto LAB_0021e52b;
        }
        cVar1 = *to;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()(&write,from,to);
      from = ::fmt::v10::detail::
             parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                       (to,"",(format_string_checker<char> *)local_108);
    }
LAB_0021e52b:
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_108;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_150,(v10 *)"Empty active operational dataset JSON",(string_view)ZEXT816(0x25),
               args);
    local_178._0_4_ = kNotFound;
    std::__cxx11::string::string((string *)local_170,(string *)&local_150);
    Error::operator=(__return_storage_ptr__,(Error *)local_178);
    std::__cxx11::string::~string((string *)local_170);
    std::__cxx11::string::~string((string *)&local_150);
  }
  else {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::get<ot::commissioner::ActiveOperationalDataset,_ot::commissioner::ActiveOperationalDataset,_0>
              ((ActiveOperationalDataset *)local_108,&json);
    ActiveOperationalDataset::operator=(aDataset,(ActiveOperationalDataset *)local_108);
    ActiveOperationalDataset::~ActiveOperationalDataset((ActiveOperationalDataset *)local_108);
  }
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&json);
  return __return_storage_ptr__;
}

Assistant:

Error ActiveDatasetFromJson(ActiveOperationalDataset &aDataset, const std::string &aJson)
{
    Error error;

    aDataset = ActiveOperationalDataset{};

    try
    {
        Json json = Json::parse(StripComments(aJson));
        if (json.is_null())
        {
            error = ERROR_NOT_FOUND("Empty active operational dataset JSON");
        }
        else
        {
            aDataset = json;
        }

    } catch (JsonException &e)
    {
        error = e.GetError();
    } catch (std::exception &e)
    {
        error = {ErrorCode::kInvalidArgs, e.what()};
    }

    return error;
}